

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# minilua.c
# Opt level: O0

void body(LexState *ls,expdesc *e,int needself,int line)

{
  TString *name;
  undefined1 local_278 [8];
  FuncState new_fs;
  int line_local;
  int needself_local;
  expdesc *e_local;
  LexState *ls_local;
  
  new_fs.actvar._396_4_ = line;
  new_fs._596_4_ = needself;
  open_func(ls,(FuncState *)local_278);
  *(undefined4 *)((long)local_278 + 0x60) = new_fs.actvar._396_4_;
  checknext(ls,0x28);
  if (new_fs._596_4_ != 0) {
    name = luaX_newstring(ls,"self",4);
    new_localvar(ls,name,0);
    adjustlocalvars(ls,1);
  }
  parlist(ls);
  checknext(ls,0x29);
  chunk(ls);
  *(int *)((long)local_278 + 100) = ls->linenumber;
  check_match(ls,0x106,0x109,new_fs.actvar._396_4_);
  close_func(ls);
  pushclosure(ls,(FuncState *)local_278,e);
  return;
}

Assistant:

static void body(LexState*ls,expdesc*e,int needself,int line){
FuncState new_fs;
open_func(ls,&new_fs);
new_fs.f->linedefined=line;
checknext(ls,'(');
if(needself){
new_localvarliteral(ls,"self",0);
adjustlocalvars(ls,1);
}
parlist(ls);
checknext(ls,')');
chunk(ls);
new_fs.f->lastlinedefined=ls->linenumber;
check_match(ls,TK_END,TK_FUNCTION,line);
close_func(ls);
pushclosure(ls,&new_fs,e);
}